

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::ConstantPaddingLayerParams
          (ConstantPaddingLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ConstantPaddingLayerParams_0076acf0;
  (this->padamounts_).rep_ = (Rep *)0x0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->padamounts_).current_size_ = 0;
  (this->padamounts_).total_size_ = 0;
  if (this != (ConstantPaddingLayerParams *)&_ConstantPaddingLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  this->value_ = 0.0;
  this->padtogivenoutputsizemode_ = false;
  this->_cached_size_ = 0;
  return;
}

Assistant:

ConstantPaddingLayerParams::ConstantPaddingLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ConstantPaddingLayerParams)
}